

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined8 extraout_RAX;
  long *plVar9;
  ulong *puVar10;
  stringstream *psVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  char flag;
  Message error;
  char buffer [256];
  int local_220;
  byte local_219;
  string local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  long local_170;
  long local_168;
  long lStack_160;
  string local_158;
  string local_138 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
LAB_001591b4:
  sVar3 = read(this->read_fd_,&local_219,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x001591cd;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_001592cb;
  }
  if (iVar2 == 1) {
    if (local_219 < 0x52) {
      if (local_219 == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message((Message *)&local_178);
        ss.ptr_ = local_178.ptr_;
        poVar6 = (ostream *)(local_178.ptr_ + 0x10);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_138,0xff);
            uVar15 = (uint)sVar3;
            if ((int)uVar15 < 1) break;
            *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar15 & 0x7fffffff)) = 0
            ;
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_138,sVar7);
          }
        } while ((uVar15 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar15 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                             ,0x160);
          StringStreamToString(&local_158,ss.ptr_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_158._M_dataplus._M_p,local_158._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                             ,0x163);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_158._M_dataplus._M_p,
                              local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        GTestLog::~GTestLog((GTestLog *)&local_198);
        if (ss.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)ss.ptr_ + 8))(ss.ptr_);
          local_178.ptr_ = (stringstream *)0x0;
        }
      }
      else {
        if (local_219 != 0x4c) goto LAB_0015938a;
        this->outcome_ = LIVED;
      }
    }
    else if (local_219 == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_219 == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_0015938a:
      GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                         ,0x1e1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_138);
    }
    goto LAB_001592cb;
  }
  goto LAB_0015923e;
code_r0x001591cd:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_0015923e;
  goto LAB_001591b4;
LAB_0015923e:
  GTestLog::GTestLog((GTestLog *)&local_158,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1e6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_158);
LAB_001592cb:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_00159a5b;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_1f8);
  local_1d8 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_1d8 == plVar9) {
    local_1c8 = *plVar9;
    lStack_1c0 = plVar5[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *plVar9;
  }
  local_1d0 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_1b8 = (ulong *)*plVar5;
  puVar10 = (ulong *)(plVar5 + 2);
  if (local_1b8 == puVar10) {
    local_1a8 = *puVar10;
    lStack_1a0 = plVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar10;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_220 = 0x1e9;
  StreamableToString<int>(&local_218,&local_220);
  uVar13 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar13 = local_1a8;
  }
  if (uVar13 < local_218._M_string_length + local_1b0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar14 = local_218.field_2._M_allocated_capacity;
    }
    if (local_218._M_string_length + local_1b0 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1b8);
      goto LAB_001596cb;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_218._M_dataplus._M_p);
LAB_001596cb:
  local_198 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_198 == puVar1) {
    local_188 = *puVar1;
    uStack_180 = puVar8[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar1;
  }
  local_190 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_178.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  psVar11 = (stringstream *)(plVar5 + 2);
  if (local_178.ptr_ == psVar11) {
    local_168 = *(long *)psVar11;
    lStack_160 = plVar5[3];
    local_178.ptr_ = (stringstream *)&local_168;
  }
  else {
    local_168 = *(long *)psVar11;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_158._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_158._M_dataplus._M_p == psVar12) {
    local_158.field_2._M_allocated_capacity = *psVar12;
    local_158.field_2._8_8_ = plVar5[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar12;
  }
  local_158._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar12) {
    local_138[0].field_2._0_8_ = *psVar12;
    local_138[0].field_2._8_8_ = plVar5[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar12;
  }
  local_138[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    DeathTestAbort(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_198);
    if (local_1e8 != (long *)0x0) {
      (**(code **)(local_1e8[0] + 8))(local_1e8);
      local_178.ptr_ = (stringstream *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_00159a5b:
  __stack_chk_fail();
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}